

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

parse_error *
nlohmann::detail::parse_error::create
          (parse_error *__return_storage_ptr__,int id_,size_t byte_,string *what_arg)

{
  string w;
  allocator<char> local_121;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"parse_error",&local_121);
  exception::name(&local_c0,&local_e0,id_);
  std::operator+(&local_a0,&local_c0,"parse error");
  if (byte_ == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"",(allocator<char> *)&local_120);
  }
  else {
    std::__cxx11::to_string(&local_120,byte_);
    std::operator+(&local_100," at byte ",&local_120);
  }
  std::operator+(&local_80,&local_a0,&local_100);
  std::operator+(&local_60,&local_80,": ");
  std::operator+(&local_40,&local_60,what_arg);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_100);
  if (byte_ != 0) {
    std::__cxx11::string::~string((string *)&local_120);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  parse_error(__return_storage_ptr__,id_,byte_,local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static parse_error create(int id_, std::size_t byte_, const std::string& what_arg)
    {
        std::string w = exception::name("parse_error", id_) + "parse error" +
                        (byte_ != 0 ? (" at byte " + std::to_string(byte_)) : "") +
                        ": " + what_arg;
        return parse_error(id_, byte_, w.c_str());
    }